

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  char *__s;
  Offset OVar3;
  Module *pMVar4;
  size_t sVar5;
  pointer *__ptr;
  __uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> local_38;
  
  __s = this->filename_;
  OVar3 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar5 = strlen(__s);
  local_38._M_t.
  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl =
       (tuple<wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>)
       operator_new(0x88);
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x18) = sVar5;
  *(char **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                   .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x20) =
       __s;
  *(Offset *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x28) = OVar3;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x38) = 1;
  *(undefined ***)
   local_38._M_t.
   super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
   super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl =
       &PTR__GlobalModuleField_0017e2b8;
  *(long **)((long)local_38._M_t.
                   super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                   .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x40) =
       (long *)((long)local_38._M_t.
                      super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                      .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x50);
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined1 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x50) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x70) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x78) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x80) = 0;
  *(Type *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x60) =
       type;
  *(bool *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                  .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 0x68) =
       mutable_;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                       *)&local_38);
  if ((_Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
      .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl !=
      (GlobalModuleField *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
                          .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  pMVar4 = this->module_;
  paVar1 = &pMVar4->features_used;
  paVar1->simd = (bool)(paVar1->simd | type.enum_ == V128);
  pbVar2 = &(pMVar4->features_used).exceptions;
  *pbVar2 = (bool)(*pbVar2 | type.enum_ == ExnRef);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = std::make_unique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  module_->features_used.simd |= (type == Type::V128);
  module_->features_used.exceptions |= (type == Type::ExnRef);
  return Result::Ok;
}